

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

optional<tinyusdz::Prim> * __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimFromTypeName
          (optional<tinyusdz::Prim> *__return_storage_ptr__,Impl *this,string *typeName,
          string *primTypeName,string *prim_name,Node *node,Specifier spec,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *primChildren,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *properties,
          PathIndexToSpecIndexMap *psmap,PrimMeta *meta,bool *is_unsupported_prim)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar1;
  bool bVar2;
  __type _Var3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar4;
  string *psVar5;
  PrimMeta *pPVar6;
  ostream *poVar7;
  string sStack_414d0;
  ostringstream aoStack_414b0 [8];
  ostringstream ss_w;
  undefined1 auStack_41338 [8];
  Prim prim_26;
  Value primdata_26;
  string sStack_40fc8;
  ostringstream aoStack_40fa8 [8];
  ostringstream ss_e_26;
  undefined1 auStack_40e30 [8];
  Material typed_prim_26;
  undefined1 auStack_40050 [8];
  Prim prim_25;
  Value primdata_25;
  string sStack_3fce0;
  ostringstream aoStack_3fcc0 [8];
  ostringstream ss_e_25;
  undefined1 auStack_3fb48 [8];
  Shader typed_prim_25;
  undefined1 auStack_3f3c0 [8];
  Prim prim_24;
  Value primdata_24;
  string sStack_3f050;
  ostringstream aoStack_3f030 [8];
  ostringstream ss_e_24;
  undefined1 auStack_3eeb8 [8];
  BlendShape typed_prim_24;
  undefined1 auStack_3e2b0 [8];
  Prim prim_23;
  Value primdata_23;
  string sStack_3df40;
  ostringstream aoStack_3df20 [8];
  ostringstream ss_e_23;
  undefined1 auStack_3dda8 [8];
  SkelAnimation typed_prim_23;
  undefined1 auStack_3ca10 [8];
  Prim prim_22;
  Value primdata_22;
  string sStack_3c6a0;
  ostringstream aoStack_3c680 [8];
  ostringstream ss_e_22;
  undefined1 auStack_3c508 [8];
  Skeleton typed_prim_22;
  undefined1 auStack_3a8b8 [8];
  Prim prim_21;
  Value primdata_21;
  string sStack_3a548;
  ostringstream aoStack_3a528 [8];
  ostringstream ss_e_21;
  undefined1 auStack_3a3b0 [8];
  SkelRoot typed_prim_21;
  undefined1 auStack_393b0 [8];
  Prim prim_20;
  Value primdata_20;
  string sStack_39040;
  ostringstream aoStack_39020 [8];
  ostringstream ss_e_20;
  undefined1 auStack_38ea8 [8];
  DistantLight typed_prim_20;
  undefined1 auStack_36d10 [8];
  Prim prim_19;
  Value primdata_19;
  string sStack_369a0;
  ostringstream aoStack_36980 [8];
  ostringstream ss_e_19;
  undefined1 auStack_36808 [8];
  DiskLight typed_prim_19;
  undefined1 auStack_343f8 [8];
  Prim prim_18;
  Value primdata_18;
  string sStack_34088;
  ostringstream aoStack_34068 [8];
  ostringstream ss_e_18;
  undefined1 auStack_33ef0 [8];
  CylinderLight typed_prim_18;
  undefined1 auStack_31858 [8];
  Prim prim_17;
  Value primdata_17;
  string sStack_314e8;
  ostringstream aoStack_314c8 [8];
  ostringstream ss_e_17;
  undefined1 auStack_31350 [8];
  DomeLight typed_prim_17;
  undefined1 auStack_2ec90 [8];
  Prim prim_16;
  Value primdata_16;
  string sStack_2e920;
  ostringstream aoStack_2e900 [8];
  ostringstream ss_e_16;
  undefined1 auStack_2e788 [8];
  SphereLight typed_prim_16;
  undefined1 auStack_2c378 [8];
  Prim prim_15;
  Value primdata_15;
  string sStack_2c008;
  ostringstream aoStack_2bfe8 [8];
  ostringstream ss_e_15;
  undefined1 auStack_2be70 [8];
  GeomSubset typed_prim_15;
  undefined1 auStack_2a8e8 [8];
  Prim prim_14;
  Value primdata_14;
  string sStack_2a578;
  ostringstream aoStack_2a558 [8];
  ostringstream ss_e_14;
  undefined1 auStack_2a3e0 [8];
  GeomCamera typed_prim_14;
  undefined1 auStack_26218 [8];
  Prim prim_13;
  Value primdata_13;
  string sStack_25ea8;
  ostringstream aoStack_25e88 [8];
  ostringstream ss_e_13;
  undefined1 auStack_25d10 [8];
  PointInstancer typed_prim_13;
  undefined1 auStack_22540 [8];
  Prim prim_12;
  Value primdata_12;
  string sStack_221d0;
  ostringstream aoStack_221b0 [8];
  ostringstream ss_e_12;
  undefined1 auStack_22038 [8];
  GeomNurbsCurves typed_prim_12;
  undefined1 auStack_1e900 [8];
  Prim prim_11;
  Value primdata_11;
  string sStack_1e590;
  ostringstream aoStack_1e570 [8];
  ostringstream ss_e_11;
  undefined1 auStack_1e3f8 [8];
  GeomBasisCurves typed_prim_11;
  undefined1 auStack_1aff8 [8];
  Prim prim_10;
  Value primdata_10;
  string sStack_1ac88;
  ostringstream aoStack_1ac68 [8];
  ostringstream ss_e_10;
  undefined1 auStack_1aaf0 [8];
  GeomCapsule typed_prim_10;
  undefined1 auStack_18500 [8];
  Prim prim_9;
  Value primdata_9;
  string sStack_18190;
  ostringstream aoStack_18170 [8];
  ostringstream ss_e_9;
  undefined1 auStack_17ff8 [8];
  GeomSphere typed_prim_9;
  undefined1 auStack_15ed8 [8];
  Prim prim_8;
  Value primdata_8;
  string sStack_15b68;
  ostringstream aoStack_15b48 [8];
  ostringstream ss_e_8;
  undefined1 auStack_159d0 [8];
  GeomCone typed_prim_8;
  undefined1 auStack_133e0 [8];
  Prim prim_7;
  Value primdata_7;
  string sStack_13070;
  ostringstream aoStack_13050 [8];
  ostringstream ss_e_7;
  undefined1 auStack_12ed8 [8];
  GeomCube typed_prim_7;
  undefined1 auStack_10db8 [8];
  Prim prim_6;
  Value primdata_6;
  string sStack_10a48;
  ostringstream aoStack_10a28 [8];
  ostringstream ss_e_6;
  undefined1 auStack_108b0 [8];
  GeomCylinder typed_prim_6;
  undefined1 local_e2c0 [8];
  Prim prim_5;
  Value primdata_5;
  string local_df50;
  ostringstream local_df30 [8];
  ostringstream ss_e_5;
  undefined1 local_ddb8 [8];
  GeomPoints typed_prim_5;
  undefined1 local_b060 [8];
  Prim prim_4;
  Value primdata_4;
  string local_acf0;
  ostringstream local_acd0 [8];
  ostringstream ss_e_4;
  undefined1 local_ab58 [8];
  GeomMesh typed_prim_4;
  undefined1 local_61c0 [8];
  Prim prim_3;
  Value primdata_3;
  string local_5e50;
  ostringstream local_5e30 [8];
  ostringstream ss_e_3;
  undefined1 local_5cb8 [8];
  Scope typed_prim_3;
  undefined1 local_4b78 [8];
  Prim prim_2;
  Value primdata_2;
  string local_4808;
  ostringstream local_47e8 [8];
  ostringstream ss_e_2;
  undefined1 local_4670 [8];
  Model typed_prim_2;
  undefined1 local_3790 [8];
  Prim prim_1;
  Value primdata_1;
  string local_3420;
  ostringstream local_3400 [8];
  ostringstream ss_e_1;
  undefined1 local_3288 [8];
  Xform typed_prim_1;
  undefined1 local_1400 [8];
  Prim prim;
  Value primdata;
  string local_1090;
  ostringstream local_1070 [8];
  ostringstream ss_e;
  undefined1 local_ef8 [8];
  Model typed_prim;
  Node *node_local;
  string *prim_name_local;
  string *primTypeName_local;
  string *typeName_local;
  Impl *this_local;
  
  if (is_unsupported_prim != (bool *)0x0) {
    *is_unsupported_prim = false;
  }
  typed_prim._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            typeName,"Model");
  if ((bVar2) ||
     (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )typeName,"__AnyType__"), bVar2)) {
    Model::Model((Model *)local_ef8);
    bVar2 = ReconstructPrim<tinyusdz::Model>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (Model *)local_ef8);
    if (bVar2) {
      PrimMetas::operator=((PrimMetas *)&typed_prim.parent_id,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 &typed_prim.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                  super__Rb_tree_header._M_node_count,(string *)prim_name);
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )typeName,"__AnyType__");
      if (bVar2) {
        ::std::__cxx11::string::operator=((string *)(typed_prim.name.field_2._M_local_buf + 8),"");
      }
      else {
        ::std::__cxx11::string::operator=
                  ((string *)(typed_prim.name.field_2._M_local_buf + 8),(string *)primTypeName);
      }
      pvVar1 = properties;
      typed_prim.prim_type_name.field_2._8_4_ = spec;
      pvVar4 = Model::propertyNames((Model *)local_ef8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = Model::primChildrenNames((Model *)local_ef8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::Model>
                ((Value *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Model *)local_ef8);
      Prim::Prim((Prim *)local_1400,prim_name,
                 (Value *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)local_1400);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)local_1400);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_1400);
      Prim::~Prim((Prim *)local_1400);
      tinyusdz::value::Value::~Value
                ((Value *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1070);
      poVar7 = ::std::operator<<((ostream *)local_1070,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x70b);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_1070,"Failed to reconstruct Model");
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_1090);
      ::std::__cxx11::string::~string((string *)&local_1090);
      ::std::__cxx11::ostringstream::~ostringstream(local_1070);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    Model::~Model((Model *)local_ef8);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_1.super_GPrim._variantSetMap._M_t._M_impl.
                                         super__Rb_tree_header._M_node_count);
  ::std::__cxx11::string::~string
            ((string *)
             &typed_prim_1.super_GPrim._variantSetMap._M_t._M_impl.super__Rb_tree_header.
              _M_node_count);
  if (_Var3) {
    Xform::Xform((Xform *)local_3288);
    bVar2 = ReconstructPrim<tinyusdz::Xform>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (Xform *)local_3288);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_1.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_1.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_1.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)local_3288);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)local_3288);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::Xform>
                ((Value *)&prim_1._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Xform *)local_3288);
      Prim::Prim((Prim *)local_3790,prim_name,
                 (Value *)&prim_1._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)local_3790);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)local_3790);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_3790);
      Prim::~Prim((Prim *)local_3790);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_1._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_3400);
      poVar7 = ::std::operator<<((ostream *)local_3400,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x720);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_3400,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_3420);
      ::std::__cxx11::string::~string((string *)&local_3420);
      ::std::__cxx11::ostringstream::~ostringstream(local_3400);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    Xform::~Xform((Xform *)local_3288);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_2._properties.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::~string
            ((string *)
             &typed_prim_2._properties.
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (_Var3) {
    Model::Model((Model *)local_4670);
    bVar2 = ReconstructPrim<tinyusdz::Model>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (Model *)local_4670);
    if (bVar2) {
      PrimMetas::operator=((PrimMetas *)&typed_prim_2.parent_id,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 &typed_prim_2.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                  super__Rb_tree_header._M_node_count,(string *)prim_name);
      pvVar1 = properties;
      typed_prim_2.prim_type_name.field_2._8_4_ = spec;
      pvVar4 = Model::propertyNames((Model *)local_4670);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = Model::primChildrenNames((Model *)local_4670);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::Model>
                ((Value *)&prim_2._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Model *)local_4670);
      Prim::Prim((Prim *)local_4b78,prim_name,
                 (Value *)&prim_2._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)local_4b78);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)local_4b78);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_4b78);
      Prim::~Prim((Prim *)local_4b78);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_2._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_47e8);
      poVar7 = ::std::operator<<((ostream *)local_47e8,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x721);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_47e8,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_4808);
      ::std::__cxx11::string::~string((string *)&local_4808);
      ::std::__cxx11::ostringstream::~ostringstream(local_47e8);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    Model::~Model((Model *)local_4670);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_3._properties.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::~string
            ((string *)
             &typed_prim_3._properties.
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (_Var3) {
    Scope::Scope((Scope *)local_5cb8);
    bVar2 = ReconstructPrim<tinyusdz::Scope>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (Scope *)local_5cb8);
    if (bVar2) {
      PrimMetas::operator=((PrimMetas *)&typed_prim_3.parent_id,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 &typed_prim_3.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                  super__Rb_tree_header._M_node_count,(string *)prim_name);
      pvVar1 = properties;
      typed_prim_3.name.field_2._8_4_ = spec;
      pvVar4 = Scope::propertyNames((Scope *)local_5cb8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = Scope::primChildrenNames((Scope *)local_5cb8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::Scope>
                ((Value *)&prim_3._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Scope *)local_5cb8);
      Prim::Prim((Prim *)local_61c0,prim_name,
                 (Value *)&prim_3._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)local_61c0);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)local_61c0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_61c0);
      Prim::~Prim((Prim *)local_61c0);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_3._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_5e30);
      poVar7 = ::std::operator<<((ostream *)local_5e30,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x722);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_5e30,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_5e50);
      ::std::__cxx11::string::~string((string *)&local_5e50);
      ::std::__cxx11::ostringstream::~ostringstream(local_5e30);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    Scope::~Scope((Scope *)local_5cb8);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_4.subsetFamilyTypeMap._M_t._M_impl.
                                         super__Rb_tree_header._M_node_count);
  ::std::__cxx11::string::~string
            ((string *)
             &typed_prim_4.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (_Var3) {
    GeomMesh::GeomMesh((GeomMesh *)local_ab58);
    bVar2 = ReconstructPrim<tinyusdz::GeomMesh>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomMesh *)local_ab58);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_4.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_4.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_4.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)local_ab58);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)local_ab58);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomMesh>
                ((Value *)&prim_4._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomMesh *)local_ab58);
      Prim::Prim((Prim *)local_b060,prim_name,
                 (Value *)&prim_4._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)local_b060);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)local_b060);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_b060);
      Prim::~Prim((Prim *)local_b060);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_4._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_acd0);
      poVar7 = ::std::operator<<((ostream *)local_acd0,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x723);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_acd0,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_acf0);
      ::std::__cxx11::string::~string((string *)&local_acf0);
      ::std::__cxx11::ostringstream::~ostringstream(local_acd0);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomMesh::~GeomMesh((GeomMesh *)local_ab58);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomPoints>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_5.accelerations._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_5.accelerations._blocked);
  if (_Var3) {
    GeomPoints::GeomPoints((GeomPoints *)local_ddb8);
    bVar2 = ReconstructPrim<tinyusdz::GeomPoints>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomPoints *)local_ddb8);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_5.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_5.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_5.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)local_ddb8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)local_ddb8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomPoints>
                ((Value *)&prim_5._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomPoints *)local_ddb8);
      Prim::Prim((Prim *)local_e2c0,prim_name,
                 (Value *)&prim_5._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)local_e2c0);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)local_e2c0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_e2c0);
      Prim::~Prim((Prim *)local_e2c0);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_5._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_df30);
      poVar7 = ::std::operator<<((ostream *)local_df30,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x724);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)local_df30,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_df50);
      ::std::__cxx11::string::~string((string *)&local_df50);
      ::std::__cxx11::ostringstream::~ostringstream(local_df30);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomPoints::~GeomPoints((GeomPoints *)local_ddb8);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomCylinder>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_6.axis._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_6.axis._blocked);
  if (_Var3) {
    GeomCylinder::GeomCylinder((GeomCylinder *)auStack_108b0);
    bVar2 = ReconstructPrim<tinyusdz::GeomCylinder>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomCylinder *)auStack_108b0);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_6.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_6.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_6.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_108b0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_108b0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomCylinder>
                ((Value *)&prim_6._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomCylinder *)auStack_108b0);
      Prim::Prim((Prim *)auStack_10db8,prim_name,
                 (Value *)&prim_6._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_10db8);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_10db8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_10db8);
      Prim::~Prim((Prim *)auStack_10db8);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_6._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_10a28);
      poVar7 = ::std::operator<<((ostream *)aoStack_10a28,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x725);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_10a28,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_10a48);
      ::std::__cxx11::string::~string((string *)&sStack_10a48);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_10a28);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomCylinder::~GeomCylinder((GeomCylinder *)auStack_108b0);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomCube>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_7.size._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_7.size._blocked);
  if (_Var3) {
    GeomCube::GeomCube((GeomCube *)auStack_12ed8);
    bVar2 = ReconstructPrim<tinyusdz::GeomCube>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomCube *)auStack_12ed8);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_7.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_7.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_7.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_12ed8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_12ed8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomCube>
                ((Value *)&prim_7._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomCube *)auStack_12ed8);
      Prim::Prim((Prim *)auStack_133e0,prim_name,
                 (Value *)&prim_7._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_133e0);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_133e0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_133e0);
      Prim::~Prim((Prim *)auStack_133e0);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_7._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_13050);
      poVar7 = ::std::operator<<((ostream *)aoStack_13050,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x726);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_13050,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_13070);
      ::std::__cxx11::string::~string((string *)&sStack_13070);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_13050);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomCube::~GeomCube((GeomCube *)auStack_12ed8);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomCone>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_8.axis._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_8.axis._blocked);
  if (_Var3) {
    GeomCone::GeomCone((GeomCone *)auStack_159d0);
    bVar2 = ReconstructPrim<tinyusdz::GeomCone>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomCone *)auStack_159d0);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_8.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_8.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_8.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_159d0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_159d0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomCone>
                ((Value *)&prim_8._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomCone *)auStack_159d0);
      Prim::Prim((Prim *)auStack_15ed8,prim_name,
                 (Value *)&prim_8._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_15ed8);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_15ed8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_15ed8);
      Prim::~Prim((Prim *)auStack_15ed8);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_8._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_15b48);
      poVar7 = ::std::operator<<((ostream *)aoStack_15b48,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x727);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_15b48,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_15b68);
      ::std::__cxx11::string::~string((string *)&sStack_15b68);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_15b48);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomCone::~GeomCone((GeomCone *)auStack_159d0);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomSphere>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_9.radius._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_9.radius._blocked);
  if (_Var3) {
    GeomSphere::GeomSphere((GeomSphere *)auStack_17ff8);
    bVar2 = ReconstructPrim<tinyusdz::GeomSphere>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomSphere *)auStack_17ff8);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_9.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_9.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28
                 ),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_9.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_17ff8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_17ff8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomSphere>
                ((Value *)&prim_9._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomSphere *)auStack_17ff8);
      Prim::Prim((Prim *)auStack_18500,prim_name,
                 (Value *)&prim_9._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_18500);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_18500);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_18500);
      Prim::~Prim((Prim *)auStack_18500);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_9._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_18170);
      poVar7 = ::std::operator<<((ostream *)aoStack_18170,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x728);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_18170,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_18190);
      ::std::__cxx11::string::~string((string *)&sStack_18190);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_18170);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomSphere::~GeomSphere((GeomSphere *)auStack_17ff8);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomCapsule>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_10.axis._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_10.axis._blocked);
  if (_Var3) {
    GeomCapsule::GeomCapsule((GeomCapsule *)auStack_1aaf0);
    bVar2 = ReconstructPrim<tinyusdz::GeomCapsule>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomCapsule *)auStack_1aaf0);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_10.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_10.super_GPrim.super_Collection._instances._m._M_t._M_impl +
                 0x28),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_10.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_1aaf0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_1aaf0);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomCapsule>
                ((Value *)&prim_10._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomCapsule *)auStack_1aaf0);
      Prim::Prim((Prim *)auStack_1aff8,prim_name,
                 (Value *)&prim_10._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_1aff8);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_1aff8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_1aff8);
      Prim::~Prim((Prim *)auStack_1aff8);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_10._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_1ac68);
      poVar7 = ::std::operator<<((ostream *)aoStack_1ac68,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x729);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_1ac68,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_1ac88);
      ::std::__cxx11::string::~string((string *)&sStack_1ac88);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_1ac68);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomCapsule::~GeomCapsule((GeomCapsule *)auStack_1aaf0);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomBasisCurves>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_11.accelerations._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_11.accelerations._blocked);
  if (_Var3) {
    GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)auStack_1e3f8);
    bVar2 = ReconstructPrim<tinyusdz::GeomBasisCurves>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomBasisCurves *)auStack_1e3f8);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_11.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_11.super_GPrim.super_Collection._instances._m._M_t._M_impl +
                 0x28),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_11.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_1e3f8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_1e3f8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomBasisCurves>
                ((Value *)&prim_11._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomBasisCurves *)auStack_1e3f8);
      Prim::Prim((Prim *)auStack_1e900,prim_name,
                 (Value *)&prim_11._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_1e900);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_1e900);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_1e900);
      Prim::~Prim((Prim *)auStack_1e900);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_11._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_1e570);
      poVar7 = ::std::operator<<((ostream *)aoStack_1e570,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x72a);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_1e570,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_1e590);
      ::std::__cxx11::string::~string((string *)&sStack_1e590);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_1e570);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)auStack_1e3f8);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomNurbsCurves>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_12.pointWeights._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_12.pointWeights._blocked);
  if (_Var3) {
    GeomNurbsCurves::GeomNurbsCurves((GeomNurbsCurves *)auStack_22038);
    bVar2 = ReconstructPrim<tinyusdz::GeomNurbsCurves>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (GeomNurbsCurves *)auStack_22038);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_12.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_12.super_GPrim.super_Collection._instances._m._M_t._M_impl +
                 0x28),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_12.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_22038);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_22038);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::GeomNurbsCurves>
                ((Value *)&prim_12._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeomNurbsCurves *)auStack_22038);
      Prim::Prim((Prim *)auStack_22540,prim_name,
                 (Value *)&prim_12._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_22540);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_22540);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_22540);
      Prim::~Prim((Prim *)auStack_22540);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_12._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_221b0);
      poVar7 = ::std::operator<<((ostream *)aoStack_221b0,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x72b);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_221b0,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_221d0);
      ::std::__cxx11::string::~string((string *)&sStack_221d0);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_221b0);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    GeomNurbsCurves::~GeomNurbsCurves((GeomNurbsCurves *)auStack_22038);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::PointInstancer>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_13.invisibleIds._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_13.invisibleIds._blocked);
  if (_Var3) {
    PointInstancer::PointInstancer((PointInstancer *)auStack_25d10);
    bVar2 = ReconstructPrim<tinyusdz::PointInstancer>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (PointInstancer *)auStack_25d10);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)
                 &typed_prim_13.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,meta);
      ::std::__cxx11::string::operator=
                ((string *)
                 ((long)&typed_prim_13.super_GPrim.super_Collection._instances._m._M_t._M_impl +
                 0x28),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_13.super_GPrim.name.field_2._8_4_ = spec;
      pvVar4 = GPrim::propertyNames((GPrim *)auStack_25d10);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_25d10);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::PointInstancer>
                ((Value *)&prim_13._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (PointInstancer *)auStack_25d10);
      Prim::Prim((Prim *)auStack_26218,prim_name,
                 (Value *)&prim_13._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_26218);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_26218);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_26218);
      Prim::~Prim((Prim *)auStack_26218);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_13._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_25e88);
      poVar7 = ::std::operator<<((ostream *)aoStack_25e88,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x72c);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_25e88,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_25ea8);
      ::std::__cxx11::string::~string((string *)&sStack_25ea8);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_25e88);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    PointInstancer::~PointInstancer((PointInstancer *)auStack_25d10);
    return __return_storage_ptr__;
  }
  tinyusdz::value::TypeTraits<tinyusdz::GeomCamera>::type_name_abi_cxx11_();
  _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_14.shutterOpen._blocked);
  ::std::__cxx11::string::~string((string *)&typed_prim_14.shutterOpen._blocked);
  if (!_Var3) {
    tinyusdz::value::TypeTraits<tinyusdz::GeomSubset>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_15._propertyNames.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &typed_prim_15._propertyNames.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (_Var3) {
      GeomSubset::GeomSubset((GeomSubset *)auStack_2be70);
      bVar2 = ReconstructPrim<tinyusdz::GeomSubset>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (GeomSubset *)auStack_2be70);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_15.props._M_t._M_impl.super__Rb_tree_header._M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_15.super_Collection._instances._m._M_t._M_impl.
                           super__Rb_tree_header + 0x20),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_15.name.field_2._8_4_ = spec;
        pvVar4 = GeomSubset::propertyNames((GeomSubset *)auStack_2be70);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = GeomSubset::primChildrenNames((GeomSubset *)auStack_2be70);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::GeomSubset>
                  ((Value *)&prim_15._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (GeomSubset *)auStack_2be70);
        Prim::Prim((Prim *)auStack_2c378,prim_name,
                   (Value *)&prim_15._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_2c378);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_2c378);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_2c378);
        Prim::~Prim((Prim *)auStack_2c378);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_15._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_2bfe8);
        poVar7 = ::std::operator<<((ostream *)aoStack_2bfe8,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x72e);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_2bfe8,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_2c008);
        ::std::__cxx11::string::~string((string *)&sStack_2c008);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_2bfe8);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      GeomSubset::~GeomSubset((GeomSubset *)auStack_2be70);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::SphereLight>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_16.radius._blocked);
    ::std::__cxx11::string::~string((string *)&typed_prim_16.radius._blocked);
    if (_Var3) {
      SphereLight::SphereLight((SphereLight *)auStack_2e788);
      bVar2 = ReconstructPrim<tinyusdz::SphereLight>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (SphereLight *)auStack_2e788);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_16.super_BoundableLight.props._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_16.super_BoundableLight.super_Collection._instances._m._M_t.
                           _M_impl + 0x28),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_16.super_BoundableLight.name.field_2._8_4_ = spec;
        pvVar4 = BoundableLight::propertyNames((BoundableLight *)auStack_2e788);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = BoundableLight::primChildrenNames((BoundableLight *)auStack_2e788);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::SphereLight>
                  ((Value *)&prim_16._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (SphereLight *)auStack_2e788);
        Prim::Prim((Prim *)auStack_2ec90,prim_name,
                   (Value *)&prim_16._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_2ec90);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_2ec90);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_2ec90);
        Prim::~Prim((Prim *)auStack_2ec90);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_16._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_2e900);
        poVar7 = ::std::operator<<((ostream *)aoStack_2e900,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x72f);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_2e900,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_2e920);
        ::std::__cxx11::string::~string((string *)&sStack_2e920);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_2e900);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      SphereLight::~SphereLight((SphereLight *)auStack_2e788);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::DomeLight>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_17.textureFormat._blocked);
    ::std::__cxx11::string::~string((string *)&typed_prim_17.textureFormat._blocked);
    if (_Var3) {
      DomeLight::DomeLight((DomeLight *)auStack_31350);
      bVar2 = ReconstructPrim<tinyusdz::DomeLight>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (DomeLight *)auStack_31350);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_17.super_NonboundableLight.props._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_17.super_NonboundableLight.super_Collection._instances._m._M_t
                           ._M_impl + 0x28),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_17.super_NonboundableLight.name.field_2._8_4_ = spec;
        pvVar4 = NonboundableLight::propertyNames((NonboundableLight *)auStack_31350);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = NonboundableLight::primChildrenNames((NonboundableLight *)auStack_31350);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::DomeLight>
                  ((Value *)&prim_17._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (DomeLight *)auStack_31350);
        Prim::Prim((Prim *)auStack_31858,prim_name,
                   (Value *)&prim_17._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_31858);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_31858);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_31858);
        Prim::~Prim((Prim *)auStack_31858);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_17._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_314c8);
        poVar7 = ::std::operator<<((ostream *)aoStack_314c8,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x730);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_314c8,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_314e8);
        ::std::__cxx11::string::~string((string *)&sStack_314e8);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_314c8);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      DomeLight::~DomeLight((DomeLight *)auStack_31350);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::CylinderLight>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_18.radius._blocked);
    ::std::__cxx11::string::~string((string *)&typed_prim_18.radius._blocked);
    if (_Var3) {
      CylinderLight::CylinderLight((CylinderLight *)auStack_33ef0);
      bVar2 = ReconstructPrim<tinyusdz::CylinderLight>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (CylinderLight *)auStack_33ef0);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_18.super_BoundableLight.props._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_18.super_BoundableLight.super_Collection._instances._m._M_t.
                           _M_impl + 0x28),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_18.super_BoundableLight.name.field_2._8_4_ = spec;
        pvVar4 = BoundableLight::propertyNames((BoundableLight *)auStack_33ef0);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = BoundableLight::primChildrenNames((BoundableLight *)auStack_33ef0);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::CylinderLight>
                  ((Value *)&prim_18._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (CylinderLight *)auStack_33ef0);
        Prim::Prim((Prim *)auStack_343f8,prim_name,
                   (Value *)&prim_18._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_343f8);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_343f8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_343f8);
        Prim::~Prim((Prim *)auStack_343f8);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_18._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_34068);
        poVar7 = ::std::operator<<((ostream *)aoStack_34068,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x731);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_34068,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_34088);
        ::std::__cxx11::string::~string((string *)&sStack_34088);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_34068);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      CylinderLight::~CylinderLight((CylinderLight *)auStack_33ef0);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::DiskLight>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_19.radius._blocked);
    ::std::__cxx11::string::~string((string *)&typed_prim_19.radius._blocked);
    if (_Var3) {
      DiskLight::DiskLight((DiskLight *)auStack_36808);
      bVar2 = ReconstructPrim<tinyusdz::DiskLight>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (DiskLight *)auStack_36808);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_19.super_BoundableLight.props._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_19.super_BoundableLight.super_Collection._instances._m._M_t.
                           _M_impl + 0x28),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_19.super_BoundableLight.name.field_2._8_4_ = spec;
        pvVar4 = BoundableLight::propertyNames((BoundableLight *)auStack_36808);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = BoundableLight::primChildrenNames((BoundableLight *)auStack_36808);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::DiskLight>
                  ((Value *)&prim_19._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (DiskLight *)auStack_36808);
        Prim::Prim((Prim *)auStack_36d10,prim_name,
                   (Value *)&prim_19._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_36d10);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_36d10);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_36d10);
        Prim::~Prim((Prim *)auStack_36d10);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_19._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_36980);
        poVar7 = ::std::operator<<((ostream *)aoStack_36980,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x732);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_36980,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_369a0);
        ::std::__cxx11::string::~string((string *)&sStack_369a0);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_36980);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      DiskLight::~DiskLight((DiskLight *)auStack_36808);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::DistantLight>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_20.angle._blocked);
    ::std::__cxx11::string::~string((string *)&typed_prim_20.angle._blocked);
    if (_Var3) {
      DistantLight::DistantLight((DistantLight *)auStack_38ea8);
      bVar2 = ReconstructPrim<tinyusdz::DistantLight>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (DistantLight *)auStack_38ea8);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_20.super_NonboundableLight.props._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_20.super_NonboundableLight.super_Collection._instances._m._M_t
                           ._M_impl + 0x28),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_20.super_NonboundableLight.name.field_2._8_4_ = spec;
        pvVar4 = NonboundableLight::propertyNames((NonboundableLight *)auStack_38ea8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = NonboundableLight::primChildrenNames((NonboundableLight *)auStack_38ea8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::DistantLight>
                  ((Value *)&prim_20._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (DistantLight *)auStack_38ea8);
        Prim::Prim((Prim *)auStack_393b0,prim_name,
                   (Value *)&prim_20._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_393b0);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_393b0);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_393b0);
        Prim::~Prim((Prim *)auStack_393b0);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_20._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_39020);
        poVar7 = ::std::operator<<((ostream *)aoStack_39020,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x733);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_39020,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_39040);
        ::std::__cxx11::string::~string((string *)&sStack_39040);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_39020);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      DistantLight::~DistantLight((DistantLight *)auStack_38ea8);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::SkelRoot>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_21._properties.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &typed_prim_21._properties.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (_Var3) {
      SkelRoot::SkelRoot((SkelRoot *)auStack_3a3b0);
      bVar2 = ReconstructPrim<tinyusdz::SkelRoot>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (SkelRoot *)auStack_3a3b0);
      if (bVar2) {
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_21.props._M_t._M_impl.super__Rb_tree_header._M_node_count,meta);
        ::std::__cxx11::string::operator=
                  ((string *)(typed_prim_21.super_Xformable._matrix.m[3] + 3),(string *)prim_name);
        pvVar1 = properties;
        typed_prim_21.name.field_2._8_4_ = spec;
        pvVar4 = SkelRoot::propertyNames((SkelRoot *)auStack_3a3b0);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = SkelRoot::primChildrenNames((SkelRoot *)auStack_3a3b0);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::SkelRoot>
                  ((Value *)&prim_21._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (SkelRoot *)auStack_3a3b0);
        Prim::Prim((Prim *)auStack_3a8b8,prim_name,
                   (Value *)&prim_21._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_3a8b8);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_3a8b8);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_3a8b8);
        Prim::~Prim((Prim *)auStack_3a8b8);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_21._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_3a528);
        poVar7 = ::std::operator<<((ostream *)aoStack_3a528,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x734);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_3a528,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_3a548);
        ::std::__cxx11::string::~string((string *)&sStack_3a548);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_3a528);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      SkelRoot::~SkelRoot((SkelRoot *)auStack_3a3b0);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::Skeleton>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_22._properties.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &typed_prim_22._properties.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (!_Var3) {
      tinyusdz::value::TypeTraits<tinyusdz::SkelAnimation>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&typed_prim_23._properties.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &typed_prim_23._properties.
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (_Var3) {
        SkelAnimation::SkelAnimation((SkelAnimation *)auStack_3dda8);
        bVar2 = ReconstructPrim<tinyusdz::SkelAnimation>
                          (this,&spec,
                           (Node *)typed_prim._properties.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                           (SkelAnimation *)auStack_3dda8);
        if (bVar2) {
          PrimMetas::operator=
                    ((PrimMetas *)
                     &typed_prim_23.props._M_t._M_impl.super__Rb_tree_header._M_node_count,meta);
          ::std::__cxx11::string::operator=((string *)auStack_3dda8,(string *)prim_name);
          pvVar1 = properties;
          typed_prim_23.name.field_2._8_4_ = spec;
          pvVar4 = SkelAnimation::propertyNames((SkelAnimation *)auStack_3dda8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          pvVar1 = primChildren;
          pvVar4 = SkelAnimation::primChildrenNames((SkelAnimation *)auStack_3dda8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          tinyusdz::value::Value::Value<tinyusdz::SkelAnimation>
                    ((Value *)&prim_23._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,(SkelAnimation *)auStack_3dda8);
          Prim::Prim((Prim *)auStack_3e2b0,prim_name,
                     (Value *)&prim_23._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
          psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_3e2b0);
          ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
          pvVar1 = primChildren;
          pPVar6 = Prim::metas((Prim *)auStack_3e2b0);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)auStack_3e2b0);
          Prim::~Prim((Prim *)auStack_3e2b0);
          tinyusdz::value::Value::~Value
                    ((Value *)&prim_23._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(aoStack_3df20);
          poVar7 = ::std::operator<<((ostream *)aoStack_3df20,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x736);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)aoStack_3df20,"Failed to reconstruct Prim ");
          poVar7 = ::std::operator<<(poVar7,(string *)typeName);
          poVar7 = ::std::operator<<(poVar7," elementName: ");
          poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&sStack_3df40);
          ::std::__cxx11::string::~string((string *)&sStack_3df40);
          ::std::__cxx11::ostringstream::~ostringstream(aoStack_3df20);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
        }
        SkelAnimation::~SkelAnimation((SkelAnimation *)auStack_3dda8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::BlendShape>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&typed_prim_24._properties.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &typed_prim_24._properties.
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (_Var3) {
        BlendShape::BlendShape((BlendShape *)auStack_3eeb8);
        bVar2 = ReconstructPrim<tinyusdz::BlendShape>
                          (this,&spec,
                           (Node *)typed_prim._properties.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                           (BlendShape *)auStack_3eeb8);
        if (bVar2) {
          PrimMetas::operator=
                    ((PrimMetas *)
                     &typed_prim_24.props._M_t._M_impl.super__Rb_tree_header._M_node_count,meta);
          ::std::__cxx11::string::operator=((string *)auStack_3eeb8,(string *)prim_name);
          pvVar1 = properties;
          typed_prim_24.name.field_2._8_4_ = spec;
          pvVar4 = BlendShape::propertyNames((BlendShape *)auStack_3eeb8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          pvVar1 = primChildren;
          pvVar4 = BlendShape::primChildrenNames((BlendShape *)auStack_3eeb8);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          tinyusdz::value::Value::Value<tinyusdz::BlendShape>
                    ((Value *)&prim_24._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,(BlendShape *)auStack_3eeb8);
          Prim::Prim((Prim *)auStack_3f3c0,prim_name,
                     (Value *)&prim_24._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
          psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_3f3c0);
          ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
          pvVar1 = primChildren;
          pPVar6 = Prim::metas((Prim *)auStack_3f3c0);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)auStack_3f3c0);
          Prim::~Prim((Prim *)auStack_3f3c0);
          tinyusdz::value::Value::~Value
                    ((Value *)&prim_24._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(aoStack_3f030);
          poVar7 = ::std::operator<<((ostream *)aoStack_3f030,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x737);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)aoStack_3f030,"Failed to reconstruct Prim ");
          poVar7 = ::std::operator<<(poVar7,(string *)typeName);
          poVar7 = ::std::operator<<(poVar7," elementName: ");
          poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&sStack_3f050);
          ::std::__cxx11::string::~string((string *)&sStack_3f050);
          ::std::__cxx11::ostringstream::~ostringstream(aoStack_3f030);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
        }
        BlendShape::~BlendShape((BlendShape *)auStack_3eeb8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Shader>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&typed_prim_25.value.v_.vtable);
      ::std::__cxx11::string::~string((string *)&typed_prim_25.value.v_.vtable);
      if (_Var3) {
        Shader::Shader((Shader *)auStack_3fb48);
        bVar2 = ReconstructPrim<tinyusdz::Shader>
                          (this,&spec,
                           (Node *)typed_prim._properties.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                           (Shader *)auStack_3fb48);
        if (bVar2) {
          PrimMetas::operator=((PrimMetas *)&typed_prim_25.super_UsdShadePrim.parent_id,meta);
          ::std::__cxx11::string::operator=((string *)auStack_3fb48,(string *)prim_name);
          pvVar1 = properties;
          typed_prim_25.super_UsdShadePrim.name.field_2._8_4_ = spec;
          pvVar4 = UsdShadePrim::propertyNames((UsdShadePrim *)auStack_3fb48);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          pvVar1 = primChildren;
          pvVar4 = UsdShadePrim::primChildrenNames((UsdShadePrim *)auStack_3fb48);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          tinyusdz::value::Value::Value<tinyusdz::Shader>
                    ((Value *)&prim_25._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,(Shader *)auStack_3fb48);
          Prim::Prim((Prim *)auStack_40050,prim_name,
                     (Value *)&prim_25._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
          psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_40050);
          ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
          pvVar1 = primChildren;
          pPVar6 = Prim::metas((Prim *)auStack_40050);
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                     &pPVar6->primChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)auStack_40050);
          Prim::~Prim((Prim *)auStack_40050);
          tinyusdz::value::Value::~Value
                    ((Value *)&prim_25._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(aoStack_3fcc0);
          poVar7 = ::std::operator<<((ostream *)aoStack_3fcc0,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x738);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)aoStack_3fcc0,"Failed to reconstruct Prim ");
          poVar7 = ::std::operator<<(poVar7,(string *)typeName);
          poVar7 = ::std::operator<<(poVar7," elementName: ");
          poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&sStack_3fce0);
          ::std::__cxx11::string::~string((string *)&sStack_3fce0);
          ::std::__cxx11::ostringstream::~ostringstream(aoStack_3fcc0);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
        }
        Shader::~Shader((Shader *)auStack_3fb48);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Material>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==(typeName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&typed_prim_26.volume._listOpQual);
      ::std::__cxx11::string::~string((string *)&typed_prim_26.volume._listOpQual);
      if (!_Var3) {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_414b0);
        poVar7 = ::std::operator<<((ostream *)aoStack_414b0,"[warn]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x73a);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_414b0,"TODO or unsupported prim type: ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushWarn(this,&sStack_414d0);
        ::std::__cxx11::string::~string((string *)&sStack_414d0);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_414b0);
        if (is_unsupported_prim != (bool *)0x0) {
          *is_unsupported_prim = true;
        }
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      Material::Material((Material *)auStack_40e30);
      bVar2 = ReconstructPrim<tinyusdz::Material>
                        (this,&spec,
                         (Node *)typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                         (Material *)auStack_40e30);
      if (bVar2) {
        PrimMetas::operator=((PrimMetas *)&typed_prim_26.super_UsdShadePrim.parent_id,meta);
        ::std::__cxx11::string::operator=((string *)auStack_40e30,(string *)prim_name);
        pvVar1 = properties;
        typed_prim_26.super_UsdShadePrim.name.field_2._8_4_ = spec;
        pvVar4 = UsdShadePrim::propertyNames((UsdShadePrim *)auStack_40e30);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        pvVar1 = primChildren;
        pvVar4 = UsdShadePrim::primChildrenNames((UsdShadePrim *)auStack_40e30);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        tinyusdz::value::Value::Value<tinyusdz::Material>
                  ((Value *)&prim_26._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (Material *)auStack_40e30);
        Prim::Prim((Prim *)auStack_41338,prim_name,
                   (Value *)&prim_26._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_41338);
        ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
        pvVar1 = primChildren;
        pPVar6 = Prim::metas((Prim *)auStack_41338);
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &pPVar6->primChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)auStack_41338);
        Prim::~Prim((Prim *)auStack_41338);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_26._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(aoStack_40fa8);
        poVar7 = ::std::operator<<((ostream *)aoStack_40fa8,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x739);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)aoStack_40fa8,"Failed to reconstruct Prim ");
        poVar7 = ::std::operator<<(poVar7,(string *)typeName);
        poVar7 = ::std::operator<<(poVar7," elementName: ");
        poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&sStack_40fc8);
        ::std::__cxx11::string::~string((string *)&sStack_40fc8);
        ::std::__cxx11::ostringstream::~ostringstream(aoStack_40fa8);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      Material::~Material((Material *)auStack_40e30);
      return __return_storage_ptr__;
    }
    Skeleton::Skeleton((Skeleton *)auStack_3c508);
    bVar2 = ReconstructPrim<tinyusdz::Skeleton>
                      (this,&spec,
                       (Node *)typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                       (Skeleton *)auStack_3c508);
    if (bVar2) {
      PrimMetas::operator=
                ((PrimMetas *)&typed_prim_22.props._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 meta);
      ::std::__cxx11::string::operator=
                ((string *)(typed_prim_22.super_Xformable._matrix.m[3] + 3),(string *)prim_name);
      pvVar1 = properties;
      typed_prim_22.name.field_2._8_4_ = spec;
      pvVar4 = Skeleton::propertyNames((Skeleton *)auStack_3c508);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      pvVar1 = primChildren;
      pvVar4 = Skeleton::primChildrenNames((Skeleton *)auStack_3c508);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      tinyusdz::value::Value::Value<tinyusdz::Skeleton>
                ((Value *)&prim_22._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Skeleton *)auStack_3c508);
      Prim::Prim((Prim *)auStack_3ca10,prim_name,
                 (Value *)&prim_22._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_3ca10);
      ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
      pvVar1 = primChildren;
      pPVar6 = Prim::metas((Prim *)auStack_3ca10);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)auStack_3ca10);
      Prim::~Prim((Prim *)auStack_3ca10);
      tinyusdz::value::Value::~Value
                ((Value *)&prim_22._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(aoStack_3c680);
      poVar7 = ::std::operator<<((ostream *)aoStack_3c680,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x735);
      ::std::operator<<(poVar7," ");
      poVar7 = ::std::operator<<((ostream *)aoStack_3c680,"Failed to reconstruct Prim ");
      poVar7 = ::std::operator<<(poVar7,(string *)typeName);
      poVar7 = ::std::operator<<(poVar7," elementName: ");
      poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&sStack_3c6a0);
      ::std::__cxx11::string::~string((string *)&sStack_3c6a0);
      ::std::__cxx11::ostringstream::~ostringstream(aoStack_3c680);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    Skeleton::~Skeleton((Skeleton *)auStack_3c508);
    return __return_storage_ptr__;
  }
  GeomCamera::GeomCamera((GeomCamera *)auStack_2a3e0);
  bVar2 = ReconstructPrim<tinyusdz::GeomCamera>
                    (this,&spec,
                     (Node *)typed_prim._properties.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,psmap,
                     (GeomCamera *)auStack_2a3e0);
  if (bVar2) {
    PrimMetas::operator=
              ((PrimMetas *)
               &typed_prim_14.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                _M_node_count,meta);
    ::std::__cxx11::string::operator=
              ((string *)
               ((long)&typed_prim_14.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28)
               ,(string *)prim_name);
    pvVar1 = properties;
    typed_prim_14.super_GPrim.name.field_2._8_4_ = spec;
    pvVar4 = GPrim::propertyNames((GPrim *)auStack_2a3e0);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
    pvVar1 = primChildren;
    pvVar4 = GPrim::primChildrenNames((GPrim *)auStack_2a3e0);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar4,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
    tinyusdz::value::Value::Value<tinyusdz::GeomCamera>
              ((Value *)&prim_14._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (GeomCamera *)auStack_2a3e0);
    Prim::Prim((Prim *)auStack_2a8e8,prim_name,
               (Value *)&prim_14._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    psVar5 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_2a8e8);
    ::std::__cxx11::string::operator=((string *)psVar5,(string *)primTypeName);
    pvVar1 = primChildren;
    pPVar6 = Prim::metas((Prim *)auStack_2a8e8);
    std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&pPVar6->primChildren,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)pvVar1);
    nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
              (__return_storage_ptr__,(Prim *)auStack_2a8e8);
    Prim::~Prim((Prim *)auStack_2a8e8);
    tinyusdz::value::Value::~Value
              ((Value *)&prim_14._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(aoStack_2a558);
    poVar7 = ::std::operator<<((ostream *)aoStack_2a558,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"ReconstructPrimFromTypeName");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x72d);
    ::std::operator<<(poVar7," ");
    poVar7 = ::std::operator<<((ostream *)aoStack_2a558,"Failed to reconstruct Prim ");
    poVar7 = ::std::operator<<(poVar7,(string *)typeName);
    poVar7 = ::std::operator<<(poVar7," elementName: ");
    poVar7 = ::std::operator<<(poVar7,(string *)prim_name);
    ::std::operator<<(poVar7,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&sStack_2a578);
    ::std::__cxx11::string::~string((string *)&sStack_2a578);
    ::std::__cxx11::ostringstream::~ostringstream(aoStack_2a558);
    nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
  }
  GeomCamera::~GeomCamera((GeomCamera *)auStack_2a3e0);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Prim> USDCReader::Impl::ReconstructPrimFromTypeName(
    const std::string &typeName, // TinyUSDZ's Prim type name
    const std::string &primTypeName, // USD's Prim typeName
    const std::string &prim_name,
    const crate::CrateReader::Node &node, const Specifier spec,
    const std::vector<value::token> &primChildren,
    const std::vector<value::token> &properties,
    const PathIndexToSpecIndexMap &psmap, const PrimMeta &meta, bool *is_unsupported_prim) {

  if (is_unsupported_prim) {
    (*is_unsupported_prim) = false; // init with false
  }


#define RECONSTRUCT_PRIM(__primty, __node_ty, __prim_name, __spec) \
  if (__node_ty == value::TypeTraits<__primty>::type_name()) {     \
    __primty typed_prim;                                           \
    if (!ReconstructPrim(__spec, node, psmap, &typed_prim)) {         \
      PUSH_ERROR("Failed to reconstruct Prim " << __node_ty << " elementName: " << __prim_name);      \
      return nonstd::nullopt;                                      \
    }                                                              \
    typed_prim.meta = meta;                                        \
    typed_prim.name = __prim_name;                                 \
    typed_prim.spec = __spec;                                      \
    typed_prim.propertyNames() = properties; \
    typed_prim.primChildrenNames() = primChildren; \
    value::Value primdata = typed_prim;                            \
    Prim prim(__prim_name, primdata);                            \
    prim.prim_type_name() = primTypeName; \
    /* also add primChildren to Prim */ \
    prim.metas().primChildren = primChildren; \
    return std::move(prim); \
  }